

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O1

void cleanup(EVP_PKEY_CTX *ctx)

{
  BigArray *pBVar1;
  BigArray *__ptr;
  
  if ((forkfd_status != 0) &&
     (forkfd_status = 0, __ptr = children.header.nextArray,
     children.header.nextArray != (BigArray *)0x0)) {
    do {
      pBVar1 = (__ptr->header).nextArray;
      free(__ptr);
      __ptr = pBVar1;
    } while (pBVar1 != (BigArray *)0x0);
  }
  return;
}

Assistant:

static void cleanup()
{
    BigArray *array;
    /* This function is not thread-safe!
     * It must only be called when the process is shutting down.
     * At shutdown, we expect no one to be calling forkfd(), so we don't
     * need to be thread-safe with what is done there.
     *
     * But SIGCHLD might be delivered to any thread, including this one.
     * There's no way to prevent that. The correct solution would be to
     * cooperatively delete. We don't do that.
     */
    if (ffd_atomic_load(&forkfd_status, FFD_ATOMIC_RELAXED) == 0)
        return;

    /* notify the handler that we're no longer in operation */
    ffd_atomic_store(&forkfd_status, 0, FFD_ATOMIC_RELAXED);

    /* free any arrays we might have */
    array = ffd_atomic_load(&children.header.nextArray, FFD_ATOMIC_ACQUIRE);
    while (array != NULL) {
        BigArray *next = ffd_atomic_load(&array->header.nextArray, FFD_ATOMIC_ACQUIRE);
        free(array);
        array = next;
    }
}